

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O0

bool IsMeshInVerboseFormat(aiMesh *mesh)

{
  uint uVar1;
  value_type vVar2;
  uint *puVar3;
  reference pvVar4;
  uint local_54;
  uint j;
  aiFace *f;
  uint i;
  allocator<unsigned_int> local_35;
  value_type_conflict4 local_34;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> seen;
  aiMesh *mesh_local;
  
  uVar1 = mesh->mNumVertices;
  local_34 = 0;
  seen.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &mesh->mPrimitiveTypes;
  std::allocator<unsigned_int>::allocator(&local_35);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,(ulong)uVar1,&local_34,
             &local_35);
  std::allocator<unsigned_int>::~allocator(&local_35);
  f._0_4_ = 0;
  do {
    if (seen.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[2] <= (uint)f) {
      mesh_local._7_1_ = true;
LAB_0056e3c1:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
      return mesh_local._7_1_;
    }
    puVar3 = (uint *)(*(long *)(seen.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x34) +
                     (ulong)(uint)f * 0x10);
    for (local_54 = 0; local_54 < *puVar3; local_54 = local_54 + 1) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
                          (ulong)*(uint *)(*(long *)(puVar3 + 2) + (ulong)local_54 * 4));
      vVar2 = *pvVar4;
      *pvVar4 = vVar2 + 1;
      if (vVar2 + 1 == 2) {
        mesh_local._7_1_ = false;
        goto LAB_0056e3c1;
      }
    }
    f._0_4_ = (uint)f + 1;
  } while( true );
}

Assistant:

bool IsMeshInVerboseFormat(const aiMesh* mesh) {
    // avoid slow vector<bool> specialization
    std::vector<unsigned int> seen(mesh->mNumVertices,0);
    for(unsigned int i = 0; i < mesh->mNumFaces; ++i) {
        const aiFace& f = mesh->mFaces[i];
        for(unsigned int j = 0; j < f.mNumIndices; ++j) {
            if(++seen[f.mIndices[j]] == 2) {
                // found a duplicate index
                return false;
            }
        }
    }

    return true;
}